

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O3

BoundingBox * __thiscall
draco::PointCloud::ComputeBoundingBox(BoundingBox *__return_storage_ptr__,PointCloud *this)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int *piVar4;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var5;
  size_t __n;
  long lVar6;
  int i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Vector3f p;
  float local_40 [4];
  
  BoundingBox::BoundingBox(__return_storage_ptr__);
  piVar4 = this->named_attribute_index_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((0 < (int)((ulong)((long)this->named_attribute_index_[0].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) &&
      (lVar7 = (long)*piVar4, lVar7 != -1)) &&
     (_Var5._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t,
     (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
     _Var5._M_t.
     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
     super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl != (PointAttribute *)0x0)) {
    local_40[2] = 0.0;
    local_40[0] = 0.0;
    local_40[1] = 0.0;
    uVar3 = *(uint *)((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     0x60);
    if ((ulong)uVar3 != 0) {
      __n = *(size_t *)
             ((long)_Var5._M_t.
                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      lVar7 = **(long **)_Var5._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      lVar6 = *(long *)((long)_Var5._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       0x30);
      uVar9 = 0;
      do {
        memcpy(local_40,(void *)(__n * uVar9 + lVar7 + lVar6),__n);
        lVar8 = 0;
        do {
          fVar2 = local_40[lVar8];
          if (fVar2 < (__return_storage_ptr__->min_point_).v_._M_elems[lVar8]) {
            (__return_storage_ptr__->min_point_).v_._M_elems[lVar8] = fVar2;
          }
          pfVar1 = (__return_storage_ptr__->max_point_).v_._M_elems + lVar8;
          if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
            (__return_storage_ptr__->max_point_).v_._M_elems[lVar8] = fVar2;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundingBox PointCloud::ComputeBoundingBox() const {
  BoundingBox bounding_box;
  auto pc_att = GetNamedAttribute(GeometryAttribute::POSITION);
  if (pc_att == nullptr) {
    // Return default invalid bounding box.
    return bounding_box;
  }

  // TODO(b/199760503): Make the BoundingBox a template type, it may not be easy
  // because PointCloud is not a template.
  // Or simply add some preconditioning here to make sure the position attribute
  // is valid, because the current code works only if the position attribute is
  // defined with 3 components of DT_FLOAT32.
  // Consider using pc_att->ConvertValue<float, 3>(i, &p[0]) (Enforced
  // transformation from Vector with any dimension to Vector3f)
  Vector3f p;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(pc_att->size());
       ++i) {
    pc_att->GetValue(i, &p[0]);
    bounding_box.Update(p);
  }
  return bounding_box;
}